

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real-time-logger-def.h
# Opt level: O0

ssize_t __thiscall
dynamicgraph::LoggerIOStream::write(LoggerIOStream *this,int __fd,void *__buf,size_t __n)

{
  ostream *poVar1;
  undefined4 in_register_00000034;
  char *c_local;
  LoggerIOStream *this_local;
  
  poVar1 = std::operator<<(this->os_,(char *)CONCAT44(in_register_00000034,__fd));
  return (ssize_t)poVar1;
}

Assistant:

virtual void write(const char *c) { os_ << c; }